

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

void __thiscall
helics::Filter::Filter
          (Filter *this,InterfaceVisibility locality,Federate *ffed,string_view filtName)

{
  Filter *pFVar1;
  
  Interface::Interface(&this->super_Interface,ffed,(InterfaceHandle)0x9aac0f00,filtName);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Filter_00446670;
  this->cloning = false;
  this->disableAssign = false;
  (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (ffed != (Federate *)0x0) {
    if (locality == GLOBAL) {
      pFVar1 = Federate::registerGlobalFilter
                         (ffed,filtName,(string_view)ZEXT816(0),(string_view)ZEXT816(0));
    }
    else {
      pFVar1 = Federate::registerFilter
                         (ffed,filtName,(string_view)ZEXT816(0),(string_view)ZEXT816(0));
    }
    (this->super_Interface).handle.hid = (pFVar1->super_Interface).handle.hid;
  }
  return;
}

Assistant:

Filter::Filter(InterfaceVisibility locality, Federate* ffed, std::string_view filtName):
    Interface(ffed, InterfaceHandle(), filtName)
{
    if (ffed != nullptr) {
        if (locality == InterfaceVisibility::GLOBAL) {
            handle = ffed->registerGlobalFilter(filtName);
        } else {
            handle = ffed->registerFilter(filtName);
        }
    }
}